

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::LocalAccessChainConvertPass::AppendConstantOperands
          (LocalAccessChainConvertPass *this,Instruction *ptrInst,
          vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *in_opnds)

{
  uint32_t iidIdx;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *in_opnds_local;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  iidIdx = 0;
  local_48._8_8_ = 0;
  in_opnds_local = in_opnds;
  local_48._M_unused._M_object = operator_new(0x18);
  *(uint32_t **)local_48._M_unused._0_8_ = &iidIdx;
  *(vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ***)
   ((long)local_48._M_unused._0_8_ + 8) = &in_opnds_local;
  *(LocalAccessChainConvertPass **)((long)local_48._M_unused._0_8_ + 0x10) = this;
  local_30 = std::
             _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_access_chain_convert_pass.cpp:61:24)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_access_chain_convert_pass.cpp:61:24)>
             ::_M_manager;
  Instruction::ForEachInId(ptrInst,(function<void_(const_unsigned_int_*)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void LocalAccessChainConvertPass::AppendConstantOperands(
    const Instruction* ptrInst, std::vector<Operand>* in_opnds) {
  uint32_t iidIdx = 0;
  ptrInst->ForEachInId([&iidIdx, &in_opnds, this](const uint32_t* iid) {
    if (iidIdx > 0) {
      const Instruction* cInst = get_def_use_mgr()->GetDef(*iid);
      const auto* constant_value =
          context()->get_constant_mgr()->GetConstantFromInst(cInst);
      assert(constant_value != nullptr &&
             "Expecting the index to be a constant.");

      // We take the sign extended value because OpAccessChain interprets the
      // index as signed.
      int64_t long_value = constant_value->GetSignExtendedValue();
      assert(long_value <= UINT32_MAX && long_value >= 0 &&
             "The index value is too large for a composite insert or extract "
             "instruction.");

      uint32_t val = static_cast<uint32_t>(long_value);
      in_opnds->push_back(
          {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {val}});
    }
    ++iidIdx;
  });
}